

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O1

void __thiscall
v_hashmap<substring,_unsigned_long>::put_after_get
          (v_hashmap<substring,_unsigned_long> *this,substring *key,uint64_t hash,unsigned_long *val
          )

{
  substring *psVar1;
  hash_elem *phVar2;
  hash_elem *phVar3;
  size_t sVar4;
  char *pcVar5;
  
  phVar2 = (this->dat)._begin;
  if ((phVar2[this->last_position].occupied == false) &&
     (phVar3 = (this->dat).end_array, sVar4 = this->num_occupants, this->num_occupants = sVar4 + 1,
     (ulong)(((long)phVar3 - (long)phVar2 >> 3) * -0x3333333333333333) <= sVar4 * 4 + 4)) {
    double_size(this);
    get(this,key,hash);
  }
  (this->dat)._begin[this->last_position].occupied = true;
  pcVar5 = key->end;
  psVar1 = &(this->dat)._begin[this->last_position].key;
  psVar1->begin = key->begin;
  psVar1->end = pcVar5;
  (this->dat)._begin[this->last_position].val = *val;
  (this->dat)._begin[this->last_position].hash = hash;
  return;
}

Assistant:

void put_after_get(const K& key, uint64_t hash, const V& val)
  {
    if (!dat[last_position].occupied)
    {
      num_occupants++;
      if (num_occupants * 4 >= base_size())  // grow when we're a quarter full
      {
        double_size();
        get(key, hash);  // probably should change last_position-- this is the lazy man's way to do it
      }
    }

    // now actually insert it
    put_after_get_nogrow(key, hash, val);
  }